

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_ExpressionFail_x_iutest_x_Comparison_Test::~iu_ExpressionFail_x_iutest_x_Comparison_Test
          (iu_ExpressionFail_x_iutest_x_Comparison_Test *this)

{
  iu_ExpressionFail_x_iutest_x_Comparison_Test *this_local;
  
  ~iu_ExpressionFail_x_iutest_x_Comparison_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(ExpressionFail, Comparison)
{
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() == 41), "expansion: 42 == 41");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() != 42), "expansion: 42 != 42");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() <  41), "expansion: 42 < 41");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() <= 41), "expansion: 42 <= 41");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() >  43), "expansion: 42 > 43");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() >= 43), "expansion: 42 >= 43");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(g() &&  0), "expansion: false && 0");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(g() ||  0), "expansion: false || 0");
}